

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O3

FILE * fopen_comp(char *file,char *mode,int32 *ispipe)

{
  FILE *pFVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  int32 isgz;
  int local_1c;
  
  guess_comptype(file,ispipe,&local_1c);
  if (*ispipe == 0) {
    pFVar1 = fopen(file,mode);
    return (FILE *)pFVar1;
  }
  if (*mode == 'w') {
    if (mode[1] != '\0') goto LAB_00118c12;
    if (local_1c == 1) {
      pcVar4 = "compress";
      pcVar3 = " -c > ";
    }
    else {
      if (local_1c == 3) {
        pcVar4 = "bzip2";
      }
      else {
        if (local_1c != 2) {
          pcVar3 = "Unknown compression type %d\n";
          lVar2 = 0xa0;
          goto LAB_00118d5c;
        }
        pcVar4 = "gzip";
      }
      pcVar3 = " > ";
    }
    pcVar3 = string_join(pcVar4,pcVar3,file,0);
    pFVar1 = popen(pcVar3,mode);
    if (pFVar1 != (FILE *)0x0) goto LAB_00118d1f;
    lVar2 = 0xa3;
  }
  else {
    if ((*mode != 'r') || (mode[1] != '\0')) {
LAB_00118c12:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
              ,0xaa,"Compressed file operation for mode %s is not supported\n",mode);
      return (FILE *)0x0;
    }
    if (local_1c == 1) {
      pcVar4 = "zcat";
      pcVar3 = " ";
    }
    else {
      if (local_1c == 3) {
        pcVar4 = "bunzip2";
      }
      else {
        if (local_1c != 2) {
          pcVar3 = "Unknown  compression type %d\n";
          lVar2 = 0x89;
LAB_00118d5c:
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                  ,lVar2,pcVar3);
          exit(1);
        }
        pcVar4 = "gunzip";
      }
      pcVar3 = " -c ";
    }
    pcVar3 = string_join(pcVar4,pcVar3,file,0);
    pFVar1 = popen(pcVar3,mode);
    if (pFVar1 != (FILE *)0x0) goto LAB_00118d1f;
    lVar2 = 0x8c;
  }
  pFVar1 = (FILE *)0x0;
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                 ,lVar2,"Failed to open a pipe for a command \'%s\' mode \'%s\'",pcVar3,mode);
LAB_00118d1f:
  ckd_free(pcVar3);
  return (FILE *)pFVar1;
}

Assistant:

FILE *
fopen_comp(const char *file, const char *mode, int32 * ispipe)
{
    FILE *fp;

#ifndef HAVE_POPEN
    *ispipe = 0; /* No popen() on WinCE */
#else /* HAVE_POPEN */
    int32 isgz;
    guess_comptype(file, ispipe, &isgz);
#endif /* HAVE_POPEN */

    if (*ispipe) {
#ifndef HAVE_POPEN
        /* Shouldn't get here, anyway */
        E_FATAL("No popen() on WinCE\n");
#else
        if (strcmp(mode, "r") == 0) {
            char *command;
            switch (isgz) {
            case COMP_GZIP:
                command = string_join("gunzip" EXEEXT, " -c ", file, NULL);
                break;
            case COMP_COMPRESS:
                command = string_join("zcat" EXEEXT, " ", file, NULL);
                break;
            case COMP_BZIP2:
                command = string_join("bunzip2" EXEEXT, " -c ", file, NULL);
                break;
            default:
                command = NULL; /* Make compiler happy. */
                E_FATAL("Unknown  compression type %d\n", isgz);
            }
            if ((fp = popen(command, mode)) == NULL) {
                E_ERROR_SYSTEM("Failed to open a pipe for a command '%s' mode '%s'", command, mode);
                ckd_free(command);
                return NULL;
            }
            ckd_free(command);
        }
        else if (strcmp(mode, "w") == 0) {
            char *command;
            switch (isgz) {
            case COMP_GZIP:
                command = string_join("gzip" EXEEXT, " > ", file, NULL);
                break;
            case COMP_COMPRESS:
                command = string_join("compress" EXEEXT, " -c > ", file, NULL);
                break;
            case COMP_BZIP2:
                command = string_join("bzip2" EXEEXT, " > ", file, NULL);
                break;
            default:
                command = NULL; /* Make compiler happy. */
                E_FATAL("Unknown compression type %d\n", isgz);
            }
            if ((fp = popen(command, mode)) == NULL) {
                E_ERROR_SYSTEM("Failed to open a pipe for a command '%s' mode '%s'", command, mode);
                ckd_free(command);
                return NULL;
            }
            ckd_free(command);
        }
        else {
            E_ERROR("Compressed file operation for mode %s is not supported\n", mode);
            return NULL;
        }
#endif /* HAVE_POPEN */
    }
    else {
        fp = fopen(file, mode);
    }

    return (fp);
}